

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O2

void __thiscall pm::Sampler::mapSamplesToHemisphere(Sampler *this,float e)

{
  pointer pVVar1;
  pointer pVVar2;
  uint uVar3;
  ulong uVar4;
  size_type __n;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector3 local_48;
  float local_38;
  
  pVVar1 = (this->hemisphereSamples_).super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __n = (long)(this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl
              .super__Vector_impl_data._M_start >> 3;
  pVVar2 = (this->hemisphereSamples_).super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (((long)pVVar2 - (long)pVVar1) / 0xc != __n) {
    if (pVVar2 != pVVar1) {
      (this->hemisphereSamples_).super__Vector_base<pm::Vector3,_std::allocator<pm::Vector3>_>.
      _M_impl.super__Vector_impl_data._M_finish = pVVar1;
    }
    std::vector<pm::Vector3,_std::allocator<pm::Vector3>_>::reserve(&this->hemisphereSamples_,__n);
    for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < __n; uVar3 = uVar3 + 1) {
      fVar5 = cosf((this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar4].x * 6.2831855);
      local_38 = sinf((this->samples_).super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar4].x * 6.2831855);
      fVar6 = powf(1.0 - (this->samples_).
                         super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar4].y,1.0 / (e + 1.0));
      fVar7 = 1.0 - fVar6 * fVar6;
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      local_48.y = fVar7 * local_38;
      local_48.x = fVar7 * fVar5;
      local_48.z = fVar6;
      std::vector<pm::Vector3,_std::allocator<pm::Vector3>_>::emplace_back<pm::Vector3>
                (&this->hemisphereSamples_,&local_48);
    }
  }
  return;
}

Assistant:

void Sampler::mapSamplesToHemisphere(float e)
{
	const size_t size = samples_.size();
	if (hemisphereSamples_.size() == size)
		return;

	hemisphereSamples_.clear();
	hemisphereSamples_.reserve(size);

	for (unsigned int i = 0; i < size; i++)
	{
		const float cosPhi = cosf(2.0f * pi * samples_[i].x);
		const float sinPhi = sinf(2.0f * pi * samples_[i].x);
		const float cosTheta = powf((1.0f - samples_[i].y), 1.0f / (e + 1.0f));
		const float sinTheta = sqrtf(1.0f - cosTheta * cosTheta);

		hemisphereSamples_.push_back(Vector3(sinTheta * cosPhi, sinTheta * sinPhi, cosTheta));
	}
}